

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallGenerator::CreateComponentTest
          (string *__return_storage_ptr__,cmInstallGenerator *this,string *component,
          bool exclude_from_all,bool all_components)

{
  undefined3 in_register_00000081;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  if (CONCAT31(in_register_00000081,all_components) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CMAKE_INSTALL_COMPONENT STREQUAL \"",&local_1a);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (!exclude_from_all) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else if (exclude_from_all) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CMAKE_INSTALL_COMPONENT",&local_19);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallGenerator::CreateComponentTest(
  const std::string& component, bool exclude_from_all, bool all_components)
{
  if (all_components) {
    if (exclude_from_all) {
      return "CMAKE_INSTALL_COMPONENT";
    }
    return {};
  }

  std::string result = "CMAKE_INSTALL_COMPONENT STREQUAL \"";
  result += component;
  result += "\"";
  if (!exclude_from_all) {
    result += " OR NOT CMAKE_INSTALL_COMPONENT";
  }

  return result;
}